

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_groups_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  pointer pcVar1;
  size_t __n;
  string *psVar2;
  pointer pbVar3;
  int iVar4;
  pointer pbVar5;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  string *local_250;
  Formatter *local_248;
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_250 = __return_storage_ptr__;
  local_248 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_groups_abi_cxx11_(&local_208,app);
  pbVar3 = local_208.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = local_250;
  for (pbVar5 = local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; local_250 = psVar2, pbVar5 != pbVar3;
      pbVar5 = pbVar5 + 1) {
    local_278._M_unused._M_object = (void *)0x0;
    local_278._8_8_ = 0;
    local_268 = (code *)0x0;
    pcStack_260 = (code *)0x0;
    local_278._M_unused._M_object = operator_new(0x18);
    *(App **)local_278._M_unused._0_8_ = app;
    *(AppFormatMode *)((long)local_278._M_unused._0_8_ + 8) = mode;
    *(pointer *)((long)local_278._M_unused._0_8_ + 0x10) = pbVar5;
    pcStack_260 = std::
                  _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6545:61)>
                  ::_M_invoke;
    local_268 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/CLI11.hpp:6545:61)>
                ::_M_manager;
    App::get_options(&local_220,app,(function<bool_(const_CLI::Option_*)> *)&local_278);
    if (local_268 != (code *)0x0) {
      (*local_268)(&local_278,&local_278,__destroy_functor);
    }
    if ((pbVar5->_M_string_length != 0) &&
       (local_220.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_220.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      local_240[0] = local_230;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,pcVar1,pcVar1 + pbVar5->_M_string_length);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
                (&local_1d0,&local_220);
      (*(local_248->super_FormatterBase)._vptr_FormatterBase[3])
                (&local_1f0,local_248,local_240,0,&local_1d0);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_1f0,local_1e8);
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0);
      }
      if (local_1d0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.
                        super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_240[0] != local_230) {
        operator_delete(local_240[0]);
      }
      __n = pbVar5->_M_string_length;
      if ((__n != local_208.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length) ||
         ((__n != 0 &&
          (iVar4 = bcmp((pbVar5->_M_dataplus)._M_p,
                        local_208.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,__n),
          iVar4 != 0)))) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      }
    }
    if (local_220.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    psVar2 = local_250;
  }
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

inline std::string Formatter::make_groups(const App *app, AppFormatMode mode) const {
    std::stringstream out;
    std::vector<std::string> groups = app->get_groups();

    // Options
    for(const std::string &group : groups) {
        std::vector<const Option *> opts = app->get_options([app, mode, &group](const Option *opt) {
            return opt->get_group() == group                    // Must be in the right group
                   && opt->nonpositional()                      // Must not be a positional
                   && (mode != AppFormatMode::Sub               // If mode is Sub, then
                       || (app->get_help_ptr() != opt           // Ignore help pointer
                           && app->get_help_all_ptr() != opt)); // Ignore help all pointer
        });
        if(!group.empty() && !opts.empty()) {
            out << make_group(group, false, opts);

            if(group != groups.back())
                out << "\n";
        }
    }

    return out.str();
}